

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

long lodepng_filesize(char *filename)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  long lVar3;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    lVar3 = -1;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    lVar3 = -1;
    if (iVar1 == 0) {
      lVar2 = ftell(__stream);
      lVar3 = -1;
      if (lVar2 != 0x7fffffffffffffff) {
        lVar3 = lVar2;
      }
    }
    fclose(__stream);
  }
  return lVar3;
}

Assistant:

static long lodepng_filesize(const char* filename) {
  FILE* file;
  long size;
  file = fopen(filename, "rb");
  if(!file) return -1;

  if(fseek(file, 0, SEEK_END) != 0) {
    fclose(file);
    return -1;
  }

  size = ftell(file);
  /* It may give LONG_MAX as directory size, this is invalid for us. */
  if(size == LONG_MAX) size = -1;

  fclose(file);
  return size;
}